

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall CConnman::AddedNodesContain(CConnman *this,CAddress *addr)

{
  pointer pAVar1;
  bool bVar2;
  long lVar3;
  pointer pAVar4;
  pointer pAVar5;
  ulong uVar6;
  pointer pAVar7;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock88;
  string addr_port_str;
  string addr_str;
  unique_lock<std::mutex> local_88;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::ToStringAddr_abi_cxx11_(&local_58,(CNetAddr *)addr);
  CService::ToStringAddrPort_abi_cxx11_(&local_78,&addr->super_CService);
  local_88._M_device = &(this->m_added_nodes_mutex).super_mutex;
  local_88._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_88);
  pAVar4 = (this->m_added_node_params).
           super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar1 = (this->m_added_node_params).
           super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pAVar1 - (long)pAVar4;
  uVar6 = (lVar3 >> 3) * -0x3333333333333333;
  if (0x17 < uVar6) {
    bVar2 = false;
    goto LAB_001aca77;
  }
  if (3 < uVar6) {
    pAVar5 = pAVar4 + (uVar6 >> 2) * 4;
    lVar3 = (uVar6 >> 2) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
              operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                         &local_58,(AddedNodeParams *)&local_78);
      pAVar7 = pAVar4;
      if (bVar2) goto LAB_001aca71;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
              operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                         &local_58,(AddedNodeParams *)&local_78);
      pAVar7 = pAVar4 + 1;
      if (bVar2) goto LAB_001aca71;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
              operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                         &local_58,(AddedNodeParams *)&local_78);
      pAVar7 = pAVar4 + 2;
      if (bVar2) goto LAB_001aca71;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
              operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                         &local_58,(AddedNodeParams *)&local_78);
      pAVar7 = pAVar4 + 3;
      if (bVar2) goto LAB_001aca71;
      pAVar4 = pAVar4 + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
    lVar3 = (long)pAVar1 - (long)pAVar5;
    pAVar4 = pAVar5;
  }
  lVar3 = (lVar3 >> 3) * -0x3333333333333333;
  if (lVar3 == 1) {
LAB_001ac99c:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
            operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                       &local_58,(AddedNodeParams *)&local_78);
    pAVar7 = pAVar4;
    if (!bVar2) {
      pAVar7 = pAVar1;
    }
  }
  else if (lVar3 == 2) {
LAB_001ac982:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>::
            operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                       &local_58,(AddedNodeParams *)&local_78);
    pAVar7 = pAVar4;
    if (!bVar2) {
      pAVar4 = pAVar4 + 1;
      goto LAB_001ac99c;
    }
  }
  else {
    pAVar7 = pAVar1;
    if ((lVar3 == 3) &&
       (bVar2 = __gnu_cxx::__ops::_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::$_0>
                ::operator()((_Iter_pred<CConnman::AddedNodesContain(CAddress_const&)const::__0> *)
                             &local_58,(AddedNodeParams *)&local_78), pAVar7 = pAVar4, !bVar2)) {
      pAVar4 = pAVar4 + 1;
      goto LAB_001ac982;
    }
  }
LAB_001aca71:
  bVar2 = pAVar7 != pAVar1;
LAB_001aca77:
  std::unique_lock<std::mutex>::~unique_lock(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CConnman::AddedNodesContain(const CAddress& addr) const
{
    AssertLockNotHeld(m_added_nodes_mutex);
    const std::string addr_str{addr.ToStringAddr()};
    const std::string addr_port_str{addr.ToStringAddrPort()};
    LOCK(m_added_nodes_mutex);
    return (m_added_node_params.size() < 24 // bound the query to a reasonable limit
            && std::any_of(m_added_node_params.cbegin(), m_added_node_params.cend(),
                           [&](const auto& p) { return p.m_added_node == addr_str || p.m_added_node == addr_port_str; }));
}